

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inverters.cpp
# Opt level: O0

Option<Kernel::TermList>
Kernel::Rebalancing::Inverters::tryInvertLinMul<Kernel::NumTraits<Kernel::RealConstantType>>
          (Term *param_1,InversionContext *param_2)

{
  anon_class_16_2_d7009eb6 fun;
  MaybeUninit<Kernel::TermList> extraout_RDX;
  Option<Kernel::TermList> OVar1;
  Term *t;
  InversionContext *in_stack_ffffffffffffffa8;
  NumTraits<Kernel::RealConstantType> local_30 [24];
  InversionContext *local_18;
  Term *local_8;
  
  t = param_1;
  local_18 = param_2;
  local_8 = param_1;
  asig<Kernel::NumTraits<Kernel::RealConstantType>>();
  InversionContext::topTerm(local_18);
  fun.ctxt = in_stack_ffffffffffffffa8;
  fun.n = local_30;
  AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>::
  ifLinMul<Kernel::Rebalancing::Inverters::tryInvertLinMul<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Rebalancing::InversionContext_const&,Kernel::NumTraits<Kernel::RealConstantType>)::_lambda(auto:1&,auto:2)_1_>
            (t,fun);
  Lib::Option<Lib::Option<Kernel::TermList>_>::flatten((Option<Lib::Option<Kernel::TermList>_> *)t);
  Lib::Option<Lib::Option<Kernel::TermList>_>::~Option
            ((Option<Lib::Option<Kernel::TermList>_> *)0x9557e5);
  OVar1.super_OptionBase<Kernel::TermList>._elem._elem = extraout_RDX._elem;
  OVar1.super_OptionBase<Kernel::TermList>._0_8_ = param_1;
  return (Option<Kernel::TermList>)OVar1.super_OptionBase<Kernel::TermList>;
}

Assistant:

Option<TermList> tryInvertLinMul(InversionContext const& ctxt, NumTraits n) {
    return asig(n)
      .ifLinMul(&ctxt.topTerm(), [&](auto& c, auto t) { 
          return someIf(c != 0, [&]() { return asig(n).linMul(1/c, ctxt.toWrap()); }); 
      })
      .flatten();
}